

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-knowledge.c
# Opt level: O3

void equip_learn_on_melee_attack(player *p)

{
  object_kind *poVar1;
  _Bool _Var2;
  wchar_t wVar3;
  object *obj;
  size_t sVar4;
  player_shape *ppVar5;
  int *piVar6;
  long lVar7;
  size_t sVar8;
  wchar_t slot;
  
  if ((p->obj_k->to_h == 0) || (p->obj_k->to_d == 0)) {
    if ((p->body).count != 0) {
      slot = L'\0';
      do {
        obj = slot_object(p,slot);
        wVar3 = slot_by_name(p,"shooting");
        if (obj != (object *)0x0 && slot != wVar3) {
          if (obj->known == (object *)0x0) {
            __assert_fail("obj->known",
                          "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/obj-knowledge.c"
                          ,0x85b,"void equip_learn_on_melee_attack(struct player *)");
          }
          poVar1 = obj->kind;
          if ((poVar1 != (object_kind *)0x0) &&
             ((poVar1->dd != (uint)obj->dd || (poVar1->ds != (uint)obj->ds)))) {
            sVar8 = 0xffffffffffffffff;
            if (rune_max != 0) {
              piVar6 = &rune_list->index;
              lVar7 = 0;
              sVar4 = rune_max;
              do {
                if ((((rune *)(piVar6 + -1))->variety == RUNE_VAR_COMBAT) && (*piVar6 == 4)) {
                  sVar8 = lVar7 >> 0x20;
                  break;
                }
                lVar7 = lVar7 + 0x100000000;
                piVar6 = piVar6 + 6;
                sVar4 = sVar4 - 1;
              } while (sVar4 != 0);
            }
            player_learn_rune(p,sVar8,true);
          }
          _Var2 = object_has_standard_to_h(obj);
          if (!_Var2) {
            sVar8 = 0xffffffffffffffff;
            if (rune_max != 0) {
              piVar6 = &rune_list->index;
              lVar7 = 0;
              sVar4 = rune_max;
              do {
                if ((((rune *)(piVar6 + -1))->variety == RUNE_VAR_COMBAT) && (*piVar6 == 1)) {
                  sVar8 = lVar7 >> 0x20;
                  break;
                }
                lVar7 = lVar7 + 0x100000000;
                piVar6 = piVar6 + 6;
                sVar4 = sVar4 - 1;
              } while (sVar4 != 0);
            }
            player_learn_rune(p,sVar8,true);
          }
          if (obj->to_d != 0) {
            sVar8 = 0xffffffffffffffff;
            if (rune_max != 0) {
              piVar6 = &rune_list->index;
              lVar7 = 0;
              sVar4 = rune_max;
              do {
                if ((((rune *)(piVar6 + -1))->variety == RUNE_VAR_COMBAT) && (*piVar6 == 2)) {
                  sVar8 = lVar7 >> 0x20;
                  break;
                }
                lVar7 = lVar7 + 0x100000000;
                piVar6 = piVar6 + 6;
                sVar4 = sVar4 - 1;
              } while (sVar4 != 0);
            }
            player_learn_rune(p,sVar8,true);
          }
          object_curses_find_to_h(p,obj);
          object_curses_find_to_d(p,obj);
          if ((p->obj_k->to_h != 0) && (p->obj_k->to_d != 0)) {
            return;
          }
        }
        slot = slot + L'\x01';
      } while ((uint)slot < (uint)(p->body).count);
    }
    if (p->shape != (player_shape *)0x0) {
      ppVar5 = lookup_player_shape(p->shape->name);
      if (ppVar5->to_h != L'\0') {
        sVar8 = 0xffffffffffffffff;
        if (rune_max != 0) {
          piVar6 = &rune_list->index;
          lVar7 = 0;
          sVar4 = rune_max;
          do {
            if ((((rune *)(piVar6 + -1))->variety == RUNE_VAR_COMBAT) && (*piVar6 == 1)) {
              sVar8 = lVar7 >> 0x20;
              break;
            }
            lVar7 = lVar7 + 0x100000000;
            piVar6 = piVar6 + 6;
            sVar4 = sVar4 - 1;
          } while (sVar4 != 0);
        }
        player_learn_rune(p,sVar8,true);
      }
      if (ppVar5->to_d != L'\0') {
        sVar8 = 0xffffffffffffffff;
        if (rune_max != 0) {
          piVar6 = &rune_list->index;
          lVar7 = 0;
          sVar4 = rune_max;
          do {
            if ((((rune *)(piVar6 + -1))->variety == RUNE_VAR_COMBAT) && (*piVar6 == 2)) {
              sVar8 = lVar7 >> 0x20;
              break;
            }
            lVar7 = lVar7 + 0x100000000;
            piVar6 = piVar6 + 6;
            sVar4 = sVar4 - 1;
          } while (sVar4 != 0);
        }
        player_learn_rune(p,sVar8,true);
        return;
      }
    }
  }
  return;
}

Assistant:

void equip_learn_on_melee_attack(struct player *p)
{
	int i;

	if (p->obj_k->to_h && p->obj_k->to_d)
		return;

	for (i = 0; i < p->body.count; i++) {
		struct object *obj = slot_object(p, i);
		if (i == slot_by_name(p, "shooting")) continue;
		if (obj) {
			assert(obj->known);
			if (!object_has_standard_dice(obj)) {
				int index = rune_index(RUNE_VAR_COMBAT, COMBAT_RUNE_DICE);
				player_learn_rune(p, index, true);
			}
			if (!object_has_standard_to_h(obj)) {
				int index = rune_index(RUNE_VAR_COMBAT, COMBAT_RUNE_TO_H);
				player_learn_rune(p, index, true);
			}
			if (obj->to_d) {
				int index = rune_index(RUNE_VAR_COMBAT, COMBAT_RUNE_TO_D);
				player_learn_rune(p, index, true);
			}
			object_curses_find_to_h(p, obj);
			object_curses_find_to_d(p, obj);
			if (p->obj_k->to_h && p->obj_k->to_d) return;
		}
	}
	if (p->shape) {
		struct player_shape *shape = lookup_player_shape(p->shape->name);
		if (shape->to_h != 0) {
			int index = rune_index(RUNE_VAR_COMBAT, COMBAT_RUNE_TO_H);
			player_learn_rune(p, index, true);
		}
		if (shape->to_d != 0) {
			int index = rune_index(RUNE_VAR_COMBAT, COMBAT_RUNE_TO_D);
			player_learn_rune(p, index, true);
		}
	}
}